

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O1

bool __thiscall
QSharedMemoryPosix::create(QSharedMemoryPosix *this,QSharedMemoryPrivate *self,qsizetype size)

{
  QArrayData *data;
  QChar *data_00;
  qsizetype size_00;
  bool bVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  char *__name;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QLatin1StringView function_00;
  QAnyStringView a;
  QString local_78;
  QString local_60;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = handle(this,self);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_004a9fd7;
  }
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  data = &((self->nativeKey).key.d.d)->super_QArrayData;
  data_00 = (QChar *)(self->nativeKey).key.d.ptr;
  size_00 = (self->nativeKey).key.d.size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toLocal8Bit_helper(&local_48,data_00,size_00);
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  do {
    __name = local_48.d.ptr;
    if (local_48.d.ptr == (char *)0x0) {
      __name = "";
    }
    __fd = shm_open(__name,0x800c2,0x180);
    if (__fd != -1) goto LAB_004a9f40;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (*piVar3 == 0x16) {
    QMetaObject::tr(&local_78,&QSharedMemory::staticMetaObject,"%1: bad name",(char *)0x0,-1);
    a.m_size = 0x4000000000000020;
    a.field_0.m_data_utf8 = "QSharedMemory::attach (shm_open)";
    QString::arg_impl(&local_60,&local_78,a,0,(QChar)0x20);
    self->error = KeyError;
    QString::operator=(&self->errorString,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    function.m_data = "QSharedMemory::attach (shm_open)";
    function.m_size = 0x20;
    QSharedMemoryPrivate::setUnixErrorString(self,function);
  }
  goto LAB_004a9fb1;
  while (piVar3 = __errno_location(), *piVar3 == 4) {
LAB_004a9f5f:
    iVar2 = close(__fd);
    if (iVar2 != -1) break;
  }
  goto LAB_004a9fb4;
  while (piVar3 = __errno_location(), *piVar3 == 4) {
LAB_004a9f40:
    iVar2 = ftruncate64(__fd,size);
    bVar1 = iVar2 != -1;
    if (bVar1) goto LAB_004a9f5f;
  }
  function_00.m_data = "QSharedMemory::create (ftruncate)";
  function_00.m_size = 0x21;
  QSharedMemoryPrivate::setUnixErrorString(self,function_00);
  do {
    iVar2 = close(__fd);
    if (iVar2 != -1) break;
  } while (*piVar3 == 4);
LAB_004a9fb1:
  bVar1 = false;
LAB_004a9fb4:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_004a9fd7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QSharedMemoryPosix::create(QSharedMemoryPrivate *self, qsizetype size)
{
    if (!handle(self))
        return false;

    const QByteArray shmName = QFile::encodeName(self->nativeKey.nativeKey());

    int fd;
    QT_EINTR_LOOP(fd, ::shm_open(shmName.constData(), O_RDWR | O_CREAT | O_EXCL | O_CLOEXEC, 0600));
    if (fd == -1) {
        const int errorNumber = errno;
        const auto function = "QSharedMemory::attach (shm_open)"_L1;
        switch (errorNumber) {
        case EINVAL:
            self->setError(QSharedMemory::KeyError,
                           QSharedMemory::tr("%1: bad name").arg(function));
            break;
        default:
            self->setUnixErrorString(function);
        }
        return false;
    }

    // the size may only be set once
    int ret;
    QT_EINTR_LOOP(ret, QT_FTRUNCATE(fd, size));
    if (ret == -1) {
        self->setUnixErrorString("QSharedMemory::create (ftruncate)"_L1);
        qt_safe_close(fd);
        return false;
    }

    qt_safe_close(fd);

    return true;
}